

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketPipeEnd::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketPipeEnd *this,ExtensionsContext ctx)

{
  WebSocket *pWVar1;
  WebSocket *pWVar2;
  WebSocket *in_RCX;
  ArrayDisposer *extraout_RDX;
  ArrayDisposer *extraout_RDX_00;
  ArrayDisposer *pAVar3;
  WebSocket *pWVar4;
  char local_40 [8];
  WebSocket *local_38;
  WebSocket *pWStack_30;
  ArrayDisposer *local_28;
  
  pWVar4 = (((this->out).own.ptr)->destinationPumpingTo).ptr;
  if (pWVar4 == (WebSocket *)0x0) {
LAB_00424c4e:
    pWVar4 = (((this->out).own.ptr)->destinationPumpingFrom).ptr;
    if (pWVar4 != (WebSocket *)0x0) {
      (*pWVar4->_vptr_WebSocket[0xb])(local_40,pWVar4,(ulong)ctx);
      pAVar3 = extraout_RDX_00;
      if (local_40[0] == '\x01') {
        in_RCX = local_38;
        pAVar3 = local_28;
        pWVar4 = pWStack_30;
      }
      if (local_40[0] != '\0') {
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)in_RCX;
        (__return_storage_ptr__->ptr).field_1.value.content.size_ = (size_t)pWVar4;
        goto LAB_00424c9a;
      }
    }
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (*pWVar4->_vptr_WebSocket[0xb])(local_40,pWVar4,(ulong)ctx);
    pWVar2 = pWStack_30;
    pWVar1 = local_38;
    pAVar3 = extraout_RDX;
    if (local_40[0] == '\x01') {
      local_38 = (WebSocket *)0x0;
      pWStack_30 = (WebSocket *)0x0;
      in_RCX = pWVar2;
      pAVar3 = local_28;
      pWVar4 = pWVar1;
    }
    if (local_40[0] == '\0') goto LAB_00424c4e;
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)pWVar4;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = (size_t)in_RCX;
LAB_00424c9a:
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = pAVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    // We want to forward this call to whatever WebSocket the other end of the pipe is pumping
    // to/from, if any. We'll check them in an arbitrary order and take the first one we see.
    // But really, the hope is that both destinationPumpingTo and destinationPumpingFrom are in fact
    // the same object. If they aren't the same, then it's not really clear whose extensions we
    // should prefer; the choice here is arbitrary.
    KJ_IF_SOME(ws, out->destinationPumpingTo) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    KJ_IF_SOME(ws, out->destinationPumpingFrom) {
      KJ_IF_SOME(result, ws.getPreferredExtensions(ctx)) {
        return kj::mv(result);
      }
    }
    return kj::none;
  }